

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

bool __thiscall ELFIO::elfio::load(elfio *this,istream *stream,bool is_lazy)

{
  elf_header *peVar1;
  bool bVar2;
  int iVar3;
  Sections SVar4;
  streampos sVar5;
  array<char,_16UL> e_ident;
  Sections local_30;
  
  std::
  vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
  ::clear(&this->sections_);
  std::
  vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
  ::clear(&this->segments_);
  e_ident._M_elems[0] = '\0';
  e_ident._M_elems[1] = '\0';
  e_ident._M_elems[2] = '\0';
  e_ident._M_elems[3] = '\0';
  e_ident._M_elems[4] = '\0';
  e_ident._M_elems[5] = '\0';
  e_ident._M_elems[6] = '\0';
  e_ident._M_elems[7] = '\0';
  e_ident._M_elems[8] = '\0';
  e_ident._M_elems[9] = '\0';
  e_ident._M_elems[10] = '\0';
  e_ident._M_elems[0xb] = '\0';
  e_ident._M_elems[0xc] = '\0';
  e_ident._M_elems[0xd] = '\0';
  e_ident._M_elems[0xe] = '\0';
  e_ident._M_elems[0xf] = '\0';
  sVar5 = address_translator::operator[](&this->addr_translator,(streampos)ZEXT816(0));
  std::istream::seekg(stream,sVar5._M_off,sVar5._M_state);
  std::istream::read((char *)stream,(long)&e_ident);
  if ((((*(long *)(stream + 8) == 0x10) && (e_ident._M_elems._0_4_ == 0x464c457f)) &&
      ((byte)(e_ident._M_elems[4] - 1U) < 2)) && ((byte)(e_ident._M_elems[5] - 1U) < 2)) {
    (this->convertor).need_conversion = e_ident._M_elems[5] != '\x01';
    create_header((elfio *)&stack0xffffffffffffffd0,(uchar)this,e_ident._M_elems[4]);
    SVar4.parent = local_30.parent;
    local_30.parent = (elfio *)0x0;
    peVar1 = (this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    (this->header)._M_t.
    super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
    super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
    super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl = (elf_header *)SVar4.parent;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[1])(peVar1);
      if (local_30.parent != (elfio *)0x0) {
        (*(code *)((((local_30.parent)->sections).parent)->segments).parent)();
      }
      SVar4.parent = (elfio *)(this->header)._M_t.
                              super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                              .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    }
    if ((SVar4.parent != (elfio *)0x0) &&
       (iVar3 = (*(code *)((((SVar4.parent)->sections).parent)->pstream)._M_t)(SVar4.parent,stream),
       (char)iVar3 != '\0')) {
      load_sections(this,stream,is_lazy);
      bVar2 = load_segments(this,stream,is_lazy);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool load( std::istream& stream, bool is_lazy = false )
    {
        sections_.clear();
        segments_.clear();

        std::array<char, EI_NIDENT> e_ident = { 0 };
        // Read ELF file signature
        stream.seekg( addr_translator[0] );
        stream.read( e_ident.data(), sizeof( e_ident ) );

        // Is it ELF file?
        if ( stream.gcount() != sizeof( e_ident ) ||
             e_ident[EI_MAG0] != ELFMAG0 || e_ident[EI_MAG1] != ELFMAG1 ||
             e_ident[EI_MAG2] != ELFMAG2 || e_ident[EI_MAG3] != ELFMAG3 ) {
            return false;
        }

        if ( ( e_ident[EI_CLASS] != ELFCLASS64 ) &&
             ( e_ident[EI_CLASS] != ELFCLASS32 ) ) {
            return false;
        }

        if ( ( e_ident[EI_DATA] != ELFDATA2LSB ) &&
             ( e_ident[EI_DATA] != ELFDATA2MSB ) ) {
            return false;
        }

        convertor.setup( e_ident[EI_DATA] );
        header = create_header( e_ident[EI_CLASS], e_ident[EI_DATA] );
        if ( nullptr == header ) {
            return false;
        }
        if ( !header->load( stream ) ) {
            return false;
        }

        load_sections( stream, is_lazy );
        bool is_still_good = load_segments( stream, is_lazy );
        return is_still_good;
    }